

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O2

void av1_cnn_convolve(float **input,int in_width,int in_height,int in_stride,
                     CNN_LAYER_CONFIG *layer_config,float **output,int out_stride,int start_idx,
                     int step)

{
  PADDING_TYPE PVar1;
  uint filt_width;
  int k;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int l_2;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int l_1;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  long lVar30;
  ulong uVar31;
  int iVar32;
  ulong uVar33;
  ulong uVar34;
  int k_4;
  int iVar35;
  uint uVar36;
  long lVar37;
  ulong uVar38;
  bool bVar39;
  float fVar40;
  float fVar41;
  int local_130;
  int v;
  int u;
  int v_1;
  int local_98;
  
  uVar20 = layer_config->in_channels;
  uVar8 = (ulong)uVar20;
  filt_width = layer_config->filter_width;
  uVar36 = layer_config->out_channels;
  uVar38 = (ulong)uVar36;
  iVar16 = uVar36 * uVar20;
  uVar25 = layer_config->filter_height;
  iVar10 = (int)uVar25 >> 1;
  iVar11 = (int)filt_width >> 1;
  uVar33 = 1;
  if (1 < step) {
    uVar33 = (ulong)(uint)step;
  }
  if ((layer_config->maxpool == 0) ||
     ((iVar4 = layer_config->skip_height, iVar4 < 2 && (layer_config->skip_width < 2)))) {
    if (filt_width == 1 && uVar25 == 1) {
      iVar10 = layer_config->skip_height;
      iVar16 = get_start_shift_convolve(in_height,1,iVar10);
      iVar11 = layer_config->skip_width;
      iVar4 = get_start_shift_convolve(in_width,1,iVar11);
      uVar9 = 0;
      uVar34 = 0;
      if (0 < (int)uVar36) {
        uVar34 = uVar38;
      }
      if ((int)uVar20 < 1) {
        uVar8 = uVar9;
      }
      for (uVar38 = 0; lVar7 = (long)iVar16, iVar14 = start_idx, uVar38 != uVar34;
          uVar38 = uVar38 + 1) {
        for (; lVar7 < in_height; lVar7 = lVar7 + iVar10) {
          lVar15 = (long)iVar14;
          for (lVar37 = (long)(iVar11 * start_idx + iVar4); lVar37 < in_width;
              lVar37 = lVar37 + iVar11 * (int)uVar33) {
            fVar40 = layer_config->bias[uVar38];
            uVar31 = uVar9;
            for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
              fVar40 = fVar40 + *(float *)((long)layer_config->weights + uVar31) *
                                input[uVar6][lVar37 + lVar7 * in_stride];
              uVar31 = uVar31 + (long)(int)uVar36 * 4;
            }
            output[uVar38][lVar15] = fVar40;
            lVar15 = lVar15 + uVar33;
          }
          iVar14 = iVar14 + out_stride;
        }
        uVar9 = uVar9 + 4;
      }
    }
    else {
      PVar1 = layer_config->pad;
      if (PVar1 == '\x02') {
        (*av1_cnn_convolve_no_maxpool_padding_valid)
                  (input,in_width,in_height,in_stride,layer_config,output,out_stride,start_idx,
                   iVar16,(int)uVar33);
      }
      else {
        iVar14 = iVar10 - (int)(uVar25 - 1) % 2;
        iVar4 = iVar11 - (int)(filt_width - 1) % 2;
        if (PVar1 == '\x01') {
          iVar10 = layer_config->skip_height;
          iVar5 = get_start_shift_convolve(in_height,uVar25,iVar10);
          iVar11 = layer_config->skip_width;
          iVar28 = get_start_shift_convolve(in_width,filt_width,iVar11);
          lVar7 = (long)start_idx;
          if ((int)uVar20 < 1) {
            uVar8 = 0;
          }
          for (; lVar7 < (int)uVar36; lVar7 = lVar7 + uVar33) {
            iVar19 = 0;
            for (iVar2 = iVar5 - iVar14; iVar2 < in_height - iVar14; iVar2 = iVar2 + iVar10) {
              lVar37 = (long)iVar19;
              for (iVar29 = iVar28 - iVar4; iVar29 < in_width - iVar4; iVar29 = iVar29 + iVar11) {
                fVar40 = layer_config->bias[lVar7];
                for (uVar38 = 0; uVar38 != uVar8; uVar38 = uVar38 + 1) {
                  lVar15 = uVar38 * (long)(int)uVar36 + lVar7;
                  for (iVar13 = iVar2; iVar13 < (int)(uVar25 + iVar2); iVar13 = iVar13 + 1) {
                    iVar3 = in_height + -1;
                    if (iVar13 < in_height) {
                      iVar3 = iVar13;
                    }
                    if (iVar13 < 0) {
                      iVar3 = 0;
                    }
                    lVar15 = (long)(int)lVar15;
                    for (iVar18 = iVar29; iVar18 < (int)(iVar29 + filt_width); iVar18 = iVar18 + 1)
                    {
                      iVar27 = in_width + -1;
                      if (iVar18 < in_width) {
                        iVar27 = iVar18;
                      }
                      if (iVar18 < 0) {
                        iVar27 = 0;
                      }
                      fVar40 = fVar40 + layer_config->weights[lVar15] *
                                        input[uVar38][iVar27 + iVar3 * in_stride];
                      lVar15 = lVar15 + iVar16;
                    }
                  }
                }
                output[lVar7][lVar37] = fVar40;
                lVar37 = lVar37 + 1;
              }
              iVar19 = iVar19 + out_stride;
            }
          }
        }
        else if (PVar1 == '\0') {
          iVar5 = layer_config->skip_height;
          iVar2 = get_start_shift_convolve(in_height,uVar25,iVar5);
          iVar28 = layer_config->skip_width;
          iVar19 = get_start_shift_convolve(in_width,filt_width,iVar28);
          uVar38 = 0;
          if (0 < (int)uVar20) {
            uVar38 = uVar8;
          }
          for (lVar7 = (long)start_idx; lVar7 < (int)uVar36; lVar7 = lVar7 + uVar33) {
            iVar13 = 0;
            uVar25 = iVar2 - iVar14;
            iVar29 = iVar2;
            while( true ) {
              uVar8 = 0;
              if (0 < (int)uVar25) {
                uVar8 = (ulong)uVar25;
              }
              if (in_height <= iVar29) break;
              iVar3 = (iVar14 - iVar29) * filt_width;
              if (iVar3 < 1) {
                iVar3 = 0;
              }
              lVar37 = (long)iVar13;
              local_98 = iVar3 * iVar16 + (int)lVar7;
              iVar3 = iVar10 + 1 + iVar29;
              if (in_height <= iVar3) {
                iVar3 = in_height;
              }
              iVar27 = ((iVar19 + iVar11) - in_width) + 1;
              uVar22 = iVar19 - iVar4;
              iVar12 = iVar4 - iVar19;
              iVar18 = iVar19;
              while( true ) {
                iVar21 = 0;
                if (0 < iVar27) {
                  iVar21 = iVar27;
                }
                iVar32 = 0;
                if (0 < iVar12) {
                  iVar32 = iVar12;
                }
                uVar34 = 0;
                if (0 < (int)uVar22) {
                  uVar34 = (ulong)uVar22;
                }
                if (in_width <= iVar18) break;
                iVar24 = iVar11 + 1 + iVar18;
                if (in_width <= iVar24) {
                  iVar24 = in_width;
                }
                fVar40 = layer_config->bias[lVar7];
                for (uVar9 = 0; uVar9 != uVar38; uVar9 = uVar9 + 1) {
                  iVar26 = (int)uVar9 * uVar36 + local_98;
                  lVar15 = (long)in_stride * 4 * uVar8;
                  for (uVar31 = uVar8; (long)uVar31 < (long)iVar3; uVar31 = uVar31 + 1) {
                    lVar30 = (long)(iVar32 * iVar16 + iVar26);
                    iVar26 = iVar26 + (iVar21 + iVar32) * uVar20 * uVar36;
                    for (uVar6 = uVar34; (long)uVar6 < (long)iVar24; uVar6 = uVar6 + 1) {
                      fVar40 = fVar40 + layer_config->weights[lVar30] *
                                        *(float *)((long)input[uVar9] + uVar6 * 4 + lVar15);
                      lVar30 = lVar30 + iVar16;
                      iVar26 = iVar26 + iVar16;
                    }
                    lVar15 = lVar15 + (long)in_stride * 4;
                  }
                }
                output[lVar7][lVar37] = fVar40;
                iVar18 = iVar18 + iVar28;
                lVar37 = lVar37 + 1;
                iVar12 = iVar12 - iVar28;
                uVar22 = uVar22 + iVar28;
                iVar27 = iVar27 + iVar28;
              }
              iVar29 = iVar29 + iVar5;
              uVar25 = uVar25 + iVar5;
              iVar13 = iVar13 + out_stride;
            }
          }
        }
      }
    }
  }
  else {
    PVar1 = layer_config->pad;
    if (PVar1 == '\x02') {
      uVar34 = 0;
      uVar33 = uVar38;
      if ((int)uVar36 < 1) {
        uVar33 = uVar34;
      }
      uVar36 = uVar25;
      if ((int)uVar25 < 1) {
        uVar36 = 0;
      }
      uVar9 = (ulong)filt_width;
      if ((int)filt_width < 1) {
        uVar9 = uVar34;
      }
      if ((int)uVar20 < 1) {
        uVar8 = uVar34;
      }
      for (; uVar34 != uVar33; uVar34 = uVar34 + 1) {
        iVar10 = 0;
        _u = 0;
        iVar11 = 0;
        while (iVar11 <= (int)(in_height - uVar25)) {
          iVar5 = iVar4 + iVar11;
          iVar14 = in_height;
          if (iVar5 < in_height) {
            iVar14 = iVar5;
          }
          _v_1 = 0;
          iVar28 = 0;
          while (iVar28 <= (int)(in_width - filt_width)) {
            iVar19 = layer_config->skip_width + iVar28;
            iVar2 = in_width;
            if (iVar19 < in_width) {
              iVar2 = iVar19;
            }
            iVar13 = iVar28 + iVar10;
            for (iVar29 = iVar11; iVar18 = iVar28, iVar3 = iVar13, iVar29 < iVar14;
                iVar29 = iVar29 + 1) {
              for (; iVar18 < iVar2; iVar18 = iVar18 + 1) {
                fVar40 = layer_config->bias[uVar34];
                for (uVar31 = 0; uVar31 != uVar8; uVar31 = uVar31 + 1) {
                  lVar7 = uVar31 * uVar38 + uVar34;
                  iVar27 = iVar3;
                  for (uVar20 = 0; uVar20 != uVar36; uVar20 = uVar20 + 1) {
                    lVar37 = (long)(int)lVar7 * 4;
                    uVar6 = uVar9;
                    iVar12 = iVar27;
                    while (bVar39 = uVar6 != 0, uVar6 = uVar6 - 1, bVar39) {
                      fVar40 = fVar40 + *(float *)((long)layer_config->weights + lVar37) *
                                        input[uVar31][iVar12];
                      iVar12 = iVar12 + 1;
                      lVar37 = lVar37 + (long)iVar16 * 4;
                    }
                    lVar7 = (long)(int)lVar7 + uVar9 * (long)iVar16;
                    iVar27 = iVar27 + in_stride;
                  }
                }
                fVar41 = fVar40;
                if ((iVar28 != iVar18 || iVar11 != iVar29) &&
                   (fVar41 = output[uVar34][_v_1 + _u * out_stride], fVar41 <= fVar40)) {
                  fVar41 = fVar40;
                }
                output[uVar34][_v_1 + _u * out_stride] = fVar41;
                iVar3 = iVar3 + 1;
              }
              iVar13 = iVar13 + in_stride;
            }
            _v_1 = _v_1 + 1;
            iVar28 = iVar19;
          }
          _u = _u + 1;
          iVar10 = iVar10 + iVar4 * in_stride;
          iVar11 = iVar5;
        }
      }
    }
    else if (PVar1 == '\x01') {
      uVar33 = 0;
      if (0 < (int)uVar36) {
        uVar33 = uVar38;
      }
      if ((int)uVar20 < 1) {
        uVar8 = 0;
      }
      if ((int)uVar25 < 1) {
        uVar25 = 0;
      }
      if ((int)filt_width < 1) {
        filt_width = 0;
      }
      for (uVar34 = 0; uVar34 != uVar33; uVar34 = uVar34 + 1) {
        lVar7 = 0;
        iVar14 = 0;
        while (iVar14 < in_height) {
          iVar28 = iVar4 + iVar14;
          iVar5 = in_height;
          if (iVar28 < in_height) {
            iVar5 = iVar28;
          }
          _v = 0;
          iVar2 = 0;
          while (iVar2 < in_width) {
            iVar29 = layer_config->skip_width + iVar2;
            iVar19 = in_width;
            if (iVar29 < in_width) {
              iVar19 = iVar29;
            }
            for (iVar13 = iVar14; iVar13 < iVar5; iVar13 = iVar13 + 1) {
              iVar3 = iVar2 - iVar11;
              for (iVar18 = iVar2; iVar18 < iVar19; iVar18 = iVar18 + 1) {
                fVar40 = layer_config->bias[uVar34];
                for (uVar9 = 0; uVar9 != uVar8; uVar9 = uVar9 + 1) {
                  lVar37 = uVar9 * uVar38 + uVar34;
                  for (uVar20 = 0; uVar20 != uVar25; uVar20 = uVar20 + 1) {
                    iVar12 = (iVar13 - iVar10) + uVar20;
                    iVar27 = in_height + -1;
                    if (iVar12 < in_height) {
                      iVar27 = iVar12;
                    }
                    if (iVar12 < 0) {
                      iVar27 = 0;
                    }
                    lVar15 = (long)(int)lVar37 * 4;
                    uVar31 = (ulong)filt_width;
                    iVar12 = iVar3;
                    while (iVar21 = (int)uVar31, uVar31 = (ulong)(iVar21 - 1), iVar21 != 0) {
                      iVar21 = in_width + -1;
                      if (iVar12 < in_width) {
                        iVar21 = iVar12;
                      }
                      if (iVar12 < 0) {
                        iVar21 = 0;
                      }
                      fVar40 = fVar40 + *(float *)((long)layer_config->weights + lVar15) *
                                        input[uVar9][iVar21 + iVar27 * in_stride];
                      lVar15 = lVar15 + (long)iVar16 * 4;
                      iVar12 = iVar12 + 1;
                    }
                    lVar37 = (long)(int)lVar37 + (ulong)filt_width * (long)iVar16;
                  }
                }
                fVar41 = fVar40;
                if ((iVar2 != iVar18 || iVar14 != iVar13) &&
                   (fVar41 = output[uVar34][_v + lVar7 * out_stride], fVar41 <= fVar40)) {
                  fVar41 = fVar40;
                }
                output[uVar34][_v + lVar7 * out_stride] = fVar41;
                iVar3 = iVar3 + 1;
              }
            }
            _v = _v + 1;
            iVar2 = iVar29;
          }
          lVar7 = lVar7 + 1;
          iVar14 = iVar28;
        }
      }
    }
    else if (PVar1 == '\0') {
      uVar34 = 0;
      uVar33 = 0;
      if (0 < (int)uVar36) {
        uVar33 = uVar38;
      }
      if ((int)uVar20 < 1) {
        uVar8 = uVar34;
      }
      uVar9 = (ulong)uVar25;
      if ((int)uVar25 < 1) {
        uVar9 = uVar34;
      }
      uVar31 = (ulong)filt_width;
      if ((int)filt_width < 1) {
        uVar31 = uVar34;
      }
      for (; uVar34 != uVar33; uVar34 = uVar34 + 1) {
        lVar7 = 0;
        iVar14 = -(iVar10 * in_stride + iVar11);
        iVar5 = 0;
        while (iVar5 < in_height) {
          iVar2 = iVar4 + iVar5;
          iVar28 = in_height;
          if (iVar2 < in_height) {
            iVar28 = iVar2;
          }
          _v = 0;
          iVar19 = 0;
          while (iVar19 < in_width) {
            iVar13 = layer_config->skip_width + iVar19;
            iVar29 = in_width;
            if (iVar13 < in_width) {
              iVar29 = iVar13;
            }
            iVar3 = iVar14 + iVar19;
            for (iVar18 = iVar5; iVar18 < iVar28; iVar18 = iVar18 + 1) {
              iVar12 = iVar19 - iVar11;
              iVar27 = iVar3;
              for (iVar21 = iVar19; iVar21 < iVar29; iVar21 = iVar21 + 1) {
                fVar40 = layer_config->bias[uVar34];
                for (uVar6 = 0; uVar6 != uVar8; uVar6 = uVar6 + 1) {
                  lVar37 = uVar6 * uVar38 + uVar34;
                  iVar32 = iVar27;
                  for (iVar24 = 0; local_130 = (int)uVar9, iVar24 != local_130; iVar24 = iVar24 + 1)
                  {
                    iVar17 = iVar24 + (iVar18 - iVar10);
                    lVar15 = (long)(int)lVar37 * 4;
                    uVar23 = uVar31;
                    iVar35 = iVar12;
                    iVar26 = iVar32;
                    while (bVar39 = uVar23 != 0, uVar23 = uVar23 - 1, bVar39) {
                      if ((((-1 < iVar17) && (iVar17 < in_height)) && (-1 < iVar35)) &&
                         (iVar35 < in_width)) {
                        fVar40 = fVar40 + *(float *)((long)layer_config->weights + lVar15) *
                                          input[uVar6][iVar26];
                      }
                      iVar26 = iVar26 + 1;
                      iVar35 = iVar35 + 1;
                      lVar15 = lVar15 + (long)iVar16 * 4;
                    }
                    lVar37 = (long)(int)lVar37 + uVar31 * (long)iVar16;
                    iVar32 = iVar32 + in_stride;
                  }
                }
                fVar41 = fVar40;
                if ((iVar19 != iVar21 || iVar5 != iVar18) &&
                   (fVar41 = output[uVar34][_v + lVar7 * out_stride], fVar41 <= fVar40)) {
                  fVar41 = fVar40;
                }
                output[uVar34][_v + lVar7 * out_stride] = fVar41;
                iVar27 = iVar27 + 1;
                iVar12 = iVar12 + 1;
              }
              iVar3 = iVar3 + in_stride;
            }
            _v = _v + 1;
            iVar19 = iVar13;
          }
          lVar7 = lVar7 + 1;
          iVar14 = iVar14 + iVar4 * in_stride;
          iVar5 = iVar2;
        }
      }
    }
  }
  return;
}

Assistant:

static void av1_cnn_convolve(const float **input, int in_width, int in_height,
                             int in_stride,
                             const CNN_LAYER_CONFIG *layer_config,
                             float **output, int out_stride, int start_idx,
                             int step) {
  assert(!layer_config->deconvolve);
  const int cstep = layer_config->in_channels * layer_config->out_channels;
  const int filter_height_half = layer_config->filter_height >> 1;
  const int filter_width_half = layer_config->filter_width >> 1;
  const int channel_step = AOMMAX(step, 1);

  if (layer_config->maxpool &&
      (layer_config->skip_height > 1 || layer_config->skip_width > 1)) {
    switch (layer_config->pad) {
      case PADDING_SAME_ZERO:
        convolve_maxpool_padding_zero(input, in_width, in_height, in_stride,
                                      layer_config, output, out_stride, cstep,
                                      filter_width_half, filter_height_half);
        break;
      case PADDING_SAME_REPLICATE:
        convolve_maxpool_padding_replicate(
            input, in_width, in_height, in_stride, layer_config, output,
            out_stride, cstep, filter_width_half, filter_height_half);
        break;
      case PADDING_VALID:
        convolve_maxpool_padding_valid(input, in_width, in_height, in_stride,
                                       layer_config, output, out_stride, cstep);
        break;
      default: assert(0 && "Unknown padding type");
    }
  } else {
    // Results in element-wise matrix multiplication.
    if (layer_config->filter_height == 1 && layer_config->filter_width == 1) {
      convolve_element_wise(input, in_width, in_height, in_stride, layer_config,
                            output, out_stride, start_idx, step);
      return;
    }
    const int ii_shift =
        filter_height_half - (layer_config->filter_height - 1) % 2;
    const int jj_shift =
        filter_width_half - (layer_config->filter_width - 1) % 2;
    switch (layer_config->pad) {
      case PADDING_SAME_ZERO:
        convolve_no_maxpool_padding_zero(
            input, in_width, in_height, in_stride, layer_config, output,
            out_stride, start_idx, cstep, filter_width_half, filter_height_half,
            ii_shift, jj_shift, channel_step);
        break;
      case PADDING_SAME_REPLICATE:
        convolve_no_maxpool_padding_replicate(
            input, in_width, in_height, in_stride, layer_config, output,
            out_stride, start_idx, cstep, ii_shift, jj_shift, channel_step);
        break;
      case PADDING_VALID:
        av1_cnn_convolve_no_maxpool_padding_valid(
            input, in_width, in_height, in_stride, layer_config, output,
            out_stride, start_idx, cstep, channel_step);
        break;
      default: assert(0 && "Unknown padding type");
    }
  }
}